

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

void __thiscall
Fossilize::DatabaseInterface::DatabaseInterface(DatabaseInterface *this,DatabaseMode mode)

{
  Impl *this_00;
  DatabaseMode mode_local;
  DatabaseInterface *this_local;
  
  this->_vptr_DatabaseInterface = (_func_int **)&PTR__DatabaseInterface_00207960;
  this_00 = (Impl *)operator_new(0x290);
  Impl::Impl(this_00);
  this->impl = this_00;
  this->impl->mode = mode;
  return;
}

Assistant:

DatabaseInterface::DatabaseInterface(DatabaseMode mode)
{
	impl = new Impl;
	impl->mode = mode;
}